

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall
Scalar::Scalar(Scalar *this,double d,string *unitPrefix,string *unitSymbol,string *name,string *type
              )

{
  allocator<char> local_111;
  string local_110;
  string local_f0;
  string local_d0;
  Unit local_b0;
  string *local_38;
  string *type_local;
  string *name_local;
  string *unitSymbol_local;
  string *unitPrefix_local;
  double d_local;
  Scalar *this_local;
  
  local_38 = type;
  type_local = name;
  name_local = unitSymbol;
  unitSymbol_local = unitPrefix;
  unitPrefix_local = (string *)d;
  d_local = (double)this;
  StochasticFunction::StochasticFunction(&this->super_StochasticFunction,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__Scalar_00190518;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__Scalar_001905c8;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__Scalar_00190610;
  this->scalarValue = (double)unitPrefix_local;
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
              physicalDescription,(string *)type_local);
  std::__cxx11::string::string((string *)&local_d0,(string *)unitPrefix);
  std::__cxx11::string::string((string *)&local_f0,(string *)unitSymbol);
  Unit::Unit(&local_b0,&local_d0,&local_f0);
  Unit::operator=(&(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
                   physicalUnit,&local_b0);
  Unit::~Unit(&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(this->super_StochasticFunction).super_StochasticProcess.stochDescription,
             "scalar");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"value",&local_111);
  Parametric::addParameter((Parametric *)this,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  return;
}

Assistant:

Scalar::Scalar(double d, string unitPrefix, string unitSymbol, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	scalarValue = d;
	physicalDescription = name;
	physicalUnit = Unit(unitPrefix, unitSymbol);
	stochDescription = "scalar";
	addParameter("value");
}